

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O0

void __thiscall
xLearn::MODEL_TEST_Init_lr_Test::MODEL_TEST_Init_lr_Test(MODEL_TEST_Init_lr_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test = (_func_int **)&PTR__MODEL_TEST_Init_lr_Test_00199fb0;
  return;
}

Assistant:

TEST(MODEL_TEST, Init_lr) {
  HyperParam hyper_param = Init();
  hyper_param.score_func = "linear";
  Model model_lr;
  model_lr.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size, 
                    0.5);
  real_t* b = model_lr.GetParameter_b();
  real_t* w = model_lr.GetParameter_w();
  index_t param_num_w = hyper_param.num_feature * 2;
  real_t* v = model_lr.GetParameter_v();
  index_t param_num_v = 0;
  EXPECT_EQ(param_num_w, model_lr.GetNumParameter_w());
  EXPECT_EQ(param_num_v, model_lr.GetNumParameter_v());
  EXPECT_EQ(param_num_v+param_num_w+2, model_lr.GetNumParameter());
  EXPECT_FLOAT_EQ(b[0], 0);
  EXPECT_FLOAT_EQ(b[1], 1.0);
  index_t aux_size = hyper_param.auxiliary_size;
  for (index_t i = 0; i < model_lr.GetNumParameter_w(); i+=aux_size) {
    EXPECT_FLOAT_EQ(w[i], 0.0);
    for (index_t j = 1; j < aux_size; ++j) {
      EXPECT_FLOAT_EQ(w[i+j], 1.0);
    }
  }
  EXPECT_EQ(v, nullptr);
}